

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanInstance.cpp
# Opt level: O3

string * __thiscall
VulkanUtilities::PrintExtensionsList_abi_cxx11_
          (string *__return_storage_ptr__,VulkanUtilities *this,
          vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *Extensions,
          size_t NumColumns)

{
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *pvVar1;
  char *pcVar2;
  void *pvVar3;
  _Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *p_Var4;
  _Vector_impl *p_Var5;
  string *psVar6;
  size_t sVar7;
  ostream *poVar8;
  undefined1 *puVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *pvVar14;
  undefined1 *puVar15;
  size_type *psVar16;
  char *pcVar17;
  long lVar18;
  bool bVar19;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ColWidth;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ExtStrings;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  string *local_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  long lStack_198;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  if (Extensions == (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)0x0) {
    Diligent::FormatString<char[26],char[15]>
              ((string *)local_1b8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"NumColumns > 0",(char (*) [15])NumColumns);
    Diligent::DebugAssertionFailed
              ((Char *)local_1b8._0_8_,"PrintExtensionsList",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x3c);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
    }
  }
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c0 = __return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&local_1d8,(*(long *)(this + 8) - *(long *)this >> 2) * 0xfc0fc0fc0fc0fc1);
  pcVar17 = *(char **)this;
  pcVar2 = *(char **)(this + 8);
  if (pcVar17 != pcVar2) {
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      if (pcVar17 == (char *)0x0) {
        std::ios::clear((int)local_1b8 + 0x10 +
                        (int)*(undefined8 *)(local_1a8._M_allocated_capacity - 0x18));
      }
      else {
        sVar7 = strlen(pcVar17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),pcVar17,sVar7);
      }
      local_1f8._M_dataplus._M_p._0_1_ = 0x20;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)(local_1b8 + 0x10),(char *)&local_1f8,1);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      local_1f8._M_dataplus._M_p._0_1_ = 0x2e;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_1f8,1);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      local_1f8._M_dataplus._M_p._0_1_ = 0x2e;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_1f8,1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::__cxx11::stringbuf::str();
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1d8,
                 &local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) !=
          &local_1f8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_),
                        local_1f8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      pcVar17 = pcVar17 + 0x104;
    } while (pcVar17 != pcVar2);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1f8,
             (size_type)Extensions,(allocator_type *)local_1b8);
  if (*(long *)(this + 8) - *(long *)this != 0) {
    puVar9 = (undefined1 *)((*(long *)(this + 8) - *(long *)this >> 2) * 0xfc0fc0fc0fc0fc1);
    puVar15 = (undefined1 *)0x0;
    do {
      if (Extensions != (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)0x0
         ) {
        psVar16 = &local_1d8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)puVar15]._M_string_length;
        pvVar14 = (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)0x1;
        do {
          uVar13 = *(ulong *)(CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                       local_1f8._M_dataplus._M_p._0_1_) + -8 + (long)pvVar14 * 8);
          uVar12 = *psVar16;
          if (*psVar16 < uVar13) {
            uVar12 = uVar13;
          }
          *(ulong *)(CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) +
                     -8 + (long)pvVar14 * 8) = uVar12;
          pvVar1 = (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                   ((long)&(pvVar14->
                           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1);
        } while ((pvVar14 < Extensions) &&
                (p_Var4 = &pvVar14->
                           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                , psVar16 = psVar16 + 4, pvVar14 = pvVar1, puVar15 + (long)p_Var4 < puVar9));
        puVar15 = (undefined1 *)
                  ((long)&((_Vector_impl_data *)(puVar15 + -1))->_M_start +
                  (long)&pvVar1->
                         super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                  );
      }
    } while (puVar15 < puVar9);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  lVar10 = *(long *)this;
  lVar11 = *(long *)(this + 8);
  if (lVar11 != lVar10) {
    uVar13 = 0;
    do {
      uVar12 = uVar13;
      if (Extensions != (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)0x0
         ) {
        lVar18 = uVar13 << 5;
        pvVar14 = (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)0x1;
        do {
          uVar12 = (long)pvVar14 + (uVar13 - 1);
          lVar10 = *(long *)this;
          lVar11 = *(long *)(this + 8);
          if ((ulong)((lVar11 - lVar10 >> 2) * 0xfc0fc0fc0fc0fc1) <= uVar12) goto LAB_0028b29f;
          pcVar17 = "    ";
          if (pvVar14 ==
              (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)0x1) {
            pcVar17 = "\n    ";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 0x10),pcVar17,
                     (ulong)(pvVar14 ==
                            (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *
                            )0x1) | 4);
          if ((pvVar14 < Extensions) &&
             ((long)&(pvVar14->
                     super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar13 <
              (ulong)((*(long *)(this + 8) - *(long *)this >> 2) * 0xfc0fc0fc0fc0fc1))) {
            *(long *)((long)&lStack_198 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) =
                 (long)*(int *)(CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                         local_1f8._M_dataplus._M_p._0_1_) + -8 + (long)pvVar14 * 8)
            ;
            *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) =
                 *(uint *)((long)auStack_190 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) &
                 0xffffff4f | 0x20;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b8 + 0x10),
                     *(char **)((long)&((local_1d8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar18),
                     *(long *)((long)&(local_1d8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_string_length
                              + lVar18));
          p_Var5 = &(pvVar14->
                    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                    )._M_impl;
          lVar18 = lVar18 + 0x20;
          bVar19 = pvVar14 != Extensions;
          pvVar14 = (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                    ((long)&(p_Var5->super__Vector_impl_data)._M_start + 1);
        } while (bVar19);
        lVar10 = *(long *)this;
        lVar11 = *(long *)(this + 8);
        uVar12 = (long)&(p_Var5->super__Vector_impl_data)._M_start + uVar13;
      }
LAB_0028b29f:
      uVar13 = uVar12;
    } while (uVar12 < (ulong)((lVar11 - lVar10 >> 2) * 0xfc0fc0fc0fc0fc1));
  }
  psVar6 = local_1c0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  pvVar3 = (void *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,local_1f8.field_2._M_allocated_capacity - (long)pvVar3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d8);
  return psVar6;
}

Assistant:

std::string PrintExtensionsList(const std::vector<VkExtensionProperties>& Extensions, size_t NumColumns)
{
    VERIFY_EXPR(NumColumns > 0);

    std::vector<std::string> ExtStrings;
    ExtStrings.reserve(Extensions.size());
    for (const auto& Ext : Extensions)
    {
        std::stringstream ss;
        ss << Ext.extensionName << ' '
           << VK_API_VERSION_MAJOR(Ext.specVersion) << '.'
           << VK_API_VERSION_MINOR(Ext.specVersion) << '.'
           << VK_API_VERSION_PATCH(Ext.specVersion);
        ExtStrings.emplace_back(ss.str());
    }

    std::vector<size_t> ColWidth(NumColumns);
    for (size_t i = 0; i < Extensions.size();)
    {
        for (size_t col = 0; col < NumColumns && i < Extensions.size(); ++col, ++i)
        {
            ColWidth[col] = std::max(ColWidth[col], ExtStrings[i].length());
        }
    }

    std::stringstream ss;
    for (size_t i = 0; i < Extensions.size();)
    {
        for (size_t col = 0; col < NumColumns && i < Extensions.size(); ++col, ++i)
        {
            ss << (col == 0 ? "\n    " : "    ");
            if (col + 1 < NumColumns && i + 1 < Extensions.size())
                ss << std::setw(static_cast<int>(ColWidth[col])) << std::left;
            ss << ExtStrings[i];
        }
    }

    return ss.str();
}